

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3IncrmergeRelease(Fts3Table *p,IncrmergeWriter *pWriter,int *pRc)

{
  int *piVar1;
  int iVar2;
  Blob *pBlob;
  sqlite3_int64 *psVar3;
  long lVar4;
  sqlite3_int64 local_88;
  NodeWriter *pNode_1;
  Blob *pBlock;
  NodeWriter *pNode;
  int *piStack_30;
  int rc;
  NodeWriter *pRoot;
  int iRoot;
  int i;
  int *pRc_local;
  IncrmergeWriter *pWriter_local;
  Fts3Table *p_local;
  
  pNode._4_4_ = *pRc;
  pRoot._0_4_ = 0xf;
  _iRoot = pRc;
  pRc_local = &pWriter->nLeafEst;
  pWriter_local = (IncrmergeWriter *)p;
  while ((piVar1 = pRc_local, -1 < (int)pRoot &&
         (lVar4 = (long)(int)pRoot, pRc_local[lVar4 * 10 + 0x16] < 1))) {
    sqlite3_free(*(void **)(pRc_local + lVar4 * 10 + 0x14));
    sqlite3_free(*(void **)(piVar1 + lVar4 * 10 + 0x10));
    pRoot._0_4_ = (int)pRoot + -1;
  }
  if (-1 < (int)pRoot) {
    if ((int)pRoot == 0) {
      pBlob = (Blob *)(pRc_local + 0x1e);
      blobGrowBuffer(pBlob,0xb,(int *)((long)&pNode + 4));
      if (pNode._4_4_ == 0) {
        *pBlob->a = '\x01';
        iVar2 = sqlite3Fts3PutVarint(pBlob->a + 1,*(sqlite_int64 *)(pRc_local + 0xe));
        piVar1[0x20] = iVar2 + 1;
      }
      pRoot._0_4_ = 1;
    }
    piStack_30 = pRc_local + (long)(int)pRoot * 10 + 0xe;
    for (pRoot._4_4_ = 0; pRoot._4_4_ < (int)pRoot; pRoot._4_4_ = pRoot._4_4_ + 1) {
      psVar3 = (sqlite3_int64 *)(pRc_local + (long)pRoot._4_4_ * 10 + 0xe);
      if ((0 < (int)psVar3[4]) && (pNode._4_4_ == 0)) {
        pNode._4_4_ = fts3WriteSegment((Fts3Table *)pWriter_local,*psVar3,(char *)psVar3[3],
                                       (int)psVar3[4]);
      }
      sqlite3_free((void *)psVar3[3]);
      sqlite3_free((void *)psVar3[1]);
    }
    if (pNode._4_4_ == 0) {
      if ((char)pRc_local[0xc] == '\0') {
        local_88 = *(sqlite3_int64 *)(pRc_local + 10);
      }
      else {
        local_88 = 0;
      }
      pNode._4_4_ = fts3WriteSegdir((Fts3Table *)pWriter_local,*(long *)(pRc_local + 2) + 1,
                                    pRc_local[4],*(sqlite3_int64 *)(pRc_local + 6),
                                    *(sqlite3_int64 *)(pRc_local + 0xe),
                                    *(sqlite3_int64 *)(pRc_local + 8),local_88,
                                    *(char **)(piStack_30 + 6),piStack_30[8]);
    }
    sqlite3_free(*(void **)(piStack_30 + 6));
    sqlite3_free(*(void **)(piStack_30 + 2));
    *_iRoot = pNode._4_4_;
  }
  return;
}

Assistant:

static void fts3IncrmergeRelease(
  Fts3Table *p,                   /* FTS3 table handle */
  IncrmergeWriter *pWriter,       /* Merge-writer object */
  int *pRc                        /* IN/OUT: Error code */
){
  int i;                          /* Used to iterate through non-root layers */
  int iRoot;                      /* Index of root in pWriter->aNodeWriter */
  NodeWriter *pRoot;              /* NodeWriter for root node */
  int rc = *pRc;                  /* Error code */

  /* Set iRoot to the index in pWriter->aNodeWriter[] of the output segment 
  ** root node. If the segment fits entirely on a single leaf node, iRoot
  ** will be set to 0. If the root node is the parent of the leaves, iRoot
  ** will be 1. And so on.  */
  for(iRoot=FTS_MAX_APPENDABLE_HEIGHT-1; iRoot>=0; iRoot--){
    NodeWriter *pNode = &pWriter->aNodeWriter[iRoot];
    if( pNode->block.n>0 ) break;
    assert( *pRc || pNode->block.nAlloc==0 );
    assert( *pRc || pNode->key.nAlloc==0 );
    sqlite3_free(pNode->block.a);
    sqlite3_free(pNode->key.a);
  }

  /* Empty output segment. This is a no-op. */
  if( iRoot<0 ) return;

  /* The entire output segment fits on a single node. Normally, this means
  ** the node would be stored as a blob in the "root" column of the %_segdir
  ** table. However, this is not permitted in this case. The problem is that 
  ** space has already been reserved in the %_segments table, and so the 
  ** start_block and end_block fields of the %_segdir table must be populated. 
  ** And, by design or by accident, released versions of FTS cannot handle 
  ** segments that fit entirely on the root node with start_block!=0.
  **
  ** Instead, create a synthetic root node that contains nothing but a 
  ** pointer to the single content node. So that the segment consists of a
  ** single leaf and a single interior (root) node.
  **
  ** Todo: Better might be to defer allocating space in the %_segments 
  ** table until we are sure it is needed.
  */
  if( iRoot==0 ){
    Blob *pBlock = &pWriter->aNodeWriter[1].block;
    blobGrowBuffer(pBlock, 1 + FTS3_VARINT_MAX, &rc);
    if( rc==SQLITE_OK ){
      pBlock->a[0] = 0x01;
      pBlock->n = 1 + sqlite3Fts3PutVarint(
          &pBlock->a[1], pWriter->aNodeWriter[0].iBlock
      );
    }
    iRoot = 1;
  }
  pRoot = &pWriter->aNodeWriter[iRoot];

  /* Flush all currently outstanding nodes to disk. */
  for(i=0; i<iRoot; i++){
    NodeWriter *pNode = &pWriter->aNodeWriter[i];
    if( pNode->block.n>0 && rc==SQLITE_OK ){
      rc = fts3WriteSegment(p, pNode->iBlock, pNode->block.a, pNode->block.n);
    }
    sqlite3_free(pNode->block.a);
    sqlite3_free(pNode->key.a);
  }

  /* Write the %_segdir record. */
  if( rc==SQLITE_OK ){
    rc = fts3WriteSegdir(p, 
        pWriter->iAbsLevel+1,               /* level */
        pWriter->iIdx,                      /* idx */
        pWriter->iStart,                    /* start_block */
        pWriter->aNodeWriter[0].iBlock,     /* leaves_end_block */
        pWriter->iEnd,                      /* end_block */
        (pWriter->bNoLeafData==0 ? pWriter->nLeafData : 0),   /* end_block */
        pRoot->block.a, pRoot->block.n      /* root */
    );
  }
  sqlite3_free(pRoot->block.a);
  sqlite3_free(pRoot->key.a);

  *pRc = rc;
}